

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string_view extension;
  char *in_RCX;
  FileDescriptor *file_00;
  undefined1 in_R8B;
  string_view prefix_00;
  string_view filename;
  string_view input;
  string_view input_00;
  string local_110;
  string local_f0;
  string local_d0;
  string name;
  string prefix;
  AlphaNum local_40;
  
  FileClassPrefix_abi_cxx11_(&prefix,this,file);
  BaseFileName_abi_cxx11_(&local_110,this,file_00);
  filename._M_str = in_RCX;
  filename._M_len = (size_t)local_110._M_dataplus._M_p;
  StripProto_abi_cxx11_(&local_f0,(compiler *)local_110._M_string_length,filename);
  input._M_str = (char *)0x1;
  input._M_len = (size_t)local_f0._M_dataplus._M_p;
  (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)local_f0._M_string_length,input,(bool)in_R8B);
  local_40.piece_._M_len = local_d0._M_string_length;
  local_40.piece_._M_str = local_d0._M_dataplus._M_p;
  absl::lts_20240722::NullSafeStringView("Root");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&name,&local_40);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  extension._M_str = "_RootClass";
  extension._M_len = 10;
  prefix_00._M_str = prefix._M_dataplus._M_p;
  prefix_00._M_len = prefix._M_string_length;
  input_00._M_str = name._M_dataplus._M_p;
  input_00._M_len = name._M_string_length;
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,prefix_00,input_00,extension,(string *)0x0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassName(const FileDescriptor* file) {
  const std::string prefix = FileClassPrefix(file);
  const std::string name = absl::StrCat(
      UnderscoresToCamelCase(StripProto(BaseFileName(file)), true), "Root");
  // There aren't really any reserved words that end in "Root", but playing
  // it safe and checking.
  return SanitizeNameForObjC(prefix, name, "_RootClass", nullptr);
}